

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

void __thiscall gnuplotio::Gnuplot::Gnuplot(Gnuplot *this,FILE *_fh)

{
  long lVar1;
  GnuplotTmpfileCollection *__p;
  file_descriptor_flags local_30;
  int local_2c;
  
  std::ios_base::ios_base((ios_base *)&this->field_0xc0);
  *(undefined8 *)&this->field_0x198 = 0;
  *(undefined2 *)&this->field_0x1a0 = 0;
  *(undefined8 *)&this->field_0x1a8 = 0;
  *(undefined8 *)&this->field_0x1b0 = 0;
  *(undefined8 *)&this->field_0x1b8 = 0;
  *(undefined8 *)&this->field_0x1c0 = 0;
  (this->super_FileHandleWrapper).wrapped_fh = _fh;
  (this->super_FileHandleWrapper).should_use_pclose = false;
  *(undefined ***)this = &PTR__Gnuplot_0010b738;
  *(undefined ***)&this->field_0xc0 = &PTR__Gnuplot_0010b760;
  local_2c = fileno((FILE *)_fh);
  local_30 = never_close_handle;
  boost::iostreams::
  stream<boost::iostreams::file_descriptor_sink,std::char_traits<char>,std::allocator<char>>::
  stream<int,boost::iostreams::file_descriptor_flags>
            ((stream<boost::iostreams::file_descriptor_sink,std::char_traits<char>,std::allocator<char>>
              *)this,&PTR_construction_vtable_24__0010b778,&local_2c,&local_30,(type *)0x0);
  *(undefined ***)this = &PTR__Gnuplot_0010b738;
  *(undefined ***)&this->field_0xc0 = &PTR__Gnuplot_0010b760;
  this->feedback = (GnuplotFeedback *)0x0;
  __p = (GnuplotTmpfileCollection *)operator_new(0x18);
  (__p->tmp_files).
  super__Vector_base<std::shared_ptr<gnuplotio::GnuplotTmpfile>,_std::allocator<std::shared_ptr<gnuplotio::GnuplotTmpfile>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->tmp_files).
  super__Vector_base<std::shared_ptr<gnuplotio::GnuplotTmpfile>,_std::allocator<std::shared_ptr<gnuplotio::GnuplotTmpfile>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->tmp_files).
  super__Vector_base<std::shared_ptr<gnuplotio::GnuplotTmpfile>,_std::allocator<std::shared_ptr<gnuplotio::GnuplotTmpfile>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tmp_files).
  super___shared_ptr<gnuplotio::GnuplotTmpfileCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<gnuplotio::GnuplotTmpfileCollection*>
            (&(this->tmp_files).
              super___shared_ptr<gnuplotio::GnuplotTmpfileCollection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__p);
  this->debug_messages = false;
  this->transport_tmpfile = false;
  lVar1 = *(long *)this;
  *(uint *)(&this->field_0x18 + *(long *)(lVar1 + -0x18)) =
       *(uint *)(&this->field_0x18 + *(long *)(lVar1 + -0x18)) & 0xfffffefb;
  *(undefined8 *)(&this->field_0x8 + *(long *)(lVar1 + -0x18)) = 0x11;
  return;
}

Assistant:

explicit Gnuplot(FILE *_fh) :
        FileHandleWrapper(_fh, 0),
        boost::iostreams::stream<boost::iostreams::file_descriptor_sink>(
            fh_fileno(),
#if BOOST_VERSION >= 104400
            boost::iostreams::never_close_handle
#else
            false
#endif
        ),
        feedback(nullptr),
        tmp_files(new GnuplotTmpfileCollection()),
        debug_messages(false),
        transport_tmpfile(false)
    {
        set_stream_options(*this);
    }